

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O0

TValue * luaH_setnum(lua_State *L,Table *t,int key)

{
  TValue *i_o;
  TValue k;
  TValue *p;
  int key_local;
  Table *t_local;
  lua_State *L_local;
  
  k._8_8_ = luaH_getnum(t,key);
  L_local = (lua_State *)k._8_8_;
  if ((TValue *)k._8_8_ == &luaO_nilobject_) {
    i_o = (TValue *)(double)key;
    k.value.b = 3;
    L_local = (lua_State *)newkey(L,t,(TValue *)&i_o);
  }
  return (TValue *)L_local;
}

Assistant:

TValue *luaH_setnum (lua_State *L, Table *t, int key) {
  const TValue *p = luaH_getnum(t, key);
  if (p != luaO_nilobject)
    return cast(TValue *, p);
  else {
    TValue k;
    setnvalue(&k, cast_num(key));
    return newkey(L, t, &k);
  }
}